

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O1

void __thiscall
cmDocumentation::AppendSection(cmDocumentation *this,char *name,cmDocumentationEntry *docs)

{
  cmDocumentationSection *pcVar1;
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> docsVec;
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> local_28;
  
  local_28.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::push_back
            (&local_28,docs);
  pcVar1 = SectionAtName(this,name);
  std::vector<cmDocumentationEntry,std::allocator<cmDocumentationEntry>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<cmDocumentationEntry_const*,std::vector<cmDocumentationEntry,std::allocator<cmDocumentationEntry>>>>
            ((vector<cmDocumentationEntry,std::allocator<cmDocumentationEntry>> *)&pcVar1->Entries,
             (pcVar1->Entries).
             super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl
             .super__Vector_impl_data._M_finish,
             local_28.
             super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl
             .super__Vector_impl_data._M_start,
             local_28.
             super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl
             .super__Vector_impl_data._M_finish);
  std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::~vector(&local_28);
  return;
}

Assistant:

void cmDocumentation::AppendSection(const char* name,
                                    cmDocumentationEntry& docs)
{

  std::vector<cmDocumentationEntry> docsVec;
  docsVec.push_back(docs);
  this->AppendSection(name, docsVec);
}